

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepvarinfo(rnndb *db,char *what,rnnvarinfo *vi,rnnvarinfo *parent)

{
  uint uVar1;
  int iVar2;
  rnnenum *prVar3;
  void *pvVar4;
  rnnvarset *prVar5;
  long in_RCX;
  long *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  rnnvarset *vs_1;
  int idx2;
  int idx1;
  char *second;
  char *end;
  int idx;
  char *first;
  char *split;
  int nvars;
  rnnvarset *vs;
  char *vars;
  rnnenum *varset;
  int i;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 uVar6;
  rnnenum *in_stack_ffffffffffffff80;
  long lVar7;
  uint in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  char *local_70;
  char *local_68;
  char *local_58;
  char *local_50;
  undefined8 *local_40;
  char *local_38;
  rnnenum *local_30;
  int local_24;
  
  if (in_RCX != 0) {
    in_RDX[4] = *(long *)(in_RCX + 0x20);
  }
  if (*in_RDX != 0) {
    iVar2 = strcmp((char *)*in_RDX,"none");
    if (iVar2 == 0) {
      in_RDX[4] = 0;
    }
    else {
      prVar3 = rnn_findenum((rnndb *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            (char *)in_stack_ffffffffffffff80);
      in_RDX[4] = (long)prVar3;
    }
  }
  if (in_RCX != 0) {
    for (local_24 = 0; local_24 < *(int *)(in_RCX + 0x38); local_24 = local_24 + 1) {
      if (*(int *)((long)in_RDX + 0x3c) <= (int)in_RDX[7]) {
        if (*(int *)((long)in_RDX + 0x3c) == 0) {
          *(undefined4 *)((long)in_RDX + 0x3c) = 0x10;
        }
        else {
          *(int *)((long)in_RDX + 0x3c) = *(int *)((long)in_RDX + 0x3c) << 1;
        }
        pvVar4 = realloc((void *)in_RDX[6],(long)*(int *)((long)in_RDX + 0x3c) << 3);
        in_RDX[6] = (long)pvVar4;
      }
      prVar5 = copyvarset((rnnvarset *)in_stack_ffffffffffffff80);
      lVar7 = in_RDX[7];
      *(int *)(in_RDX + 7) = (int)lVar7 + 1;
      *(rnnvarset **)(in_RDX[6] + (long)(int)lVar7 * 8) = prVar5;
    }
  }
  local_30 = (rnnenum *)in_RDX[4];
  if (((local_30 == (rnnenum *)0x0) && (in_RDX[1] == 0)) && (in_RCX != 0)) {
    in_RDX[1] = *(long *)(in_RCX + 8);
  }
  if (in_RDX[1] != 0) {
    local_30 = rnn_findenum((rnndb *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                            (char *)in_stack_ffffffffffffff80);
  }
  if (in_RDX[2] != 0) {
    local_38 = (char *)in_RDX[2];
    if (local_30 == (rnnenum *)0x0) {
      fprintf(_stderr,"%s: tried to use variants without active varset!\n",in_RSI);
      *(undefined4 *)(in_RDI + 0x80) = 1;
      return;
    }
    local_40 = (undefined8 *)0x0;
    uVar1 = local_30->valsnum;
    for (local_24 = 0; local_24 < (int)in_RDX[7]; local_24 = local_24 + 1) {
      if ((rnnenum *)**(long **)(in_RDX[6] + (long)local_24 * 8) == local_30) {
        local_40 = *(undefined8 **)(in_RDX[6] + (long)local_24 * 8);
        break;
      }
    }
    if (local_40 == (undefined8 *)0x0) {
      local_40 = (undefined8 *)calloc(0x10,1);
      *local_40 = local_30;
      pvVar4 = calloc(4,(long)(int)uVar1);
      local_40[1] = pvVar4;
      for (local_24 = 0; local_24 < (int)uVar1; local_24 = local_24 + 1) {
        *(undefined4 *)(local_40[1] + (long)local_24 * 4) = 1;
      }
      if (*(int *)((long)in_RDX + 0x3c) <= (int)in_RDX[7]) {
        if (*(int *)((long)in_RDX + 0x3c) == 0) {
          *(undefined4 *)((long)in_RDX + 0x3c) = 0x10;
        }
        else {
          *(int *)((long)in_RDX + 0x3c) = *(int *)((long)in_RDX + 0x3c) << 1;
        }
        pvVar4 = realloc((void *)in_RDX[6],(long)*(int *)((long)in_RDX + 0x3c) << 3);
        in_RDX[6] = (long)pvVar4;
      }
      lVar7 = in_RDX[7];
      *(int *)(in_RDX + 7) = (int)lVar7 + 1;
      *(undefined8 **)(in_RDX[6] + (long)(int)lVar7 * 8) = local_40;
    }
    while( true ) {
      for (; *local_38 == ' '; local_38 = local_38 + 1) {
      }
      if (*local_38 == '\0') break;
      local_50 = local_38;
      while( true ) {
        uVar6 = false;
        if (((*local_50 != ':') && (uVar6 = false, *local_50 != '-')) &&
           (uVar6 = false, *local_50 != ' ')) {
          uVar6 = *local_50 != '\0';
        }
        if ((bool)uVar6 == false) break;
        local_50 = local_50 + 1;
      }
      local_58 = (char *)0x0;
      if (local_50 != local_38) {
        local_58 = strndup(local_38,(long)local_50 - (long)local_38);
      }
      if ((*local_50 == ' ') || (local_68 = local_50, *local_50 == '\0')) {
        iVar2 = findvidx((rnndb *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff80,
                         (char *)CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff7e,
                                                         in_stack_ffffffffffffff78)));
        if (iVar2 != -1) {
          *(uint *)(local_40[1] + (long)iVar2 * 4) = *(uint *)(local_40[1] + (long)iVar2 * 4) | 2;
        }
        local_38 = local_50;
      }
      else {
        do {
          local_68 = local_68 + 1;
          in_stack_ffffffffffffff7e = false;
          if (*local_68 != ' ') {
            in_stack_ffffffffffffff7e = *local_68 != '\0';
          }
        } while ((bool)in_stack_ffffffffffffff7e != false);
        local_70 = (char *)0x0;
        if (local_68 != local_50 + 1) {
          local_70 = strndup(local_50 + 1,(size_t)(local_68 + (-1 - (long)local_50)));
        }
        in_stack_ffffffffffffff8c = 0;
        if (local_58 != (char *)0x0) {
          in_stack_ffffffffffffff8c =
               findvidx((rnndb *)(ulong)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                        (char *)CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff7e,
                                                        in_stack_ffffffffffffff78)));
        }
        in_stack_ffffffffffffff88 = uVar1;
        if ((local_70 != (char *)0x0) &&
           (in_stack_ffffffffffffff88 =
                 findvidx((rnndb *)CONCAT44(in_stack_ffffffffffffff8c,uVar1),
                          in_stack_ffffffffffffff80,
                          (char *)CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffff7e,
                                                          in_stack_ffffffffffffff78))),
           *local_50 == '-')) {
          in_stack_ffffffffffffff88 = in_stack_ffffffffffffff88 + 1;
        }
        if ((in_stack_ffffffffffffff8c != -1) &&
           (local_24 = in_stack_ffffffffffffff8c, in_stack_ffffffffffffff88 != 0xffffffff)) {
          for (; local_24 < (int)in_stack_ffffffffffffff88; local_24 = local_24 + 1) {
            *(uint *)(local_40[1] + (long)local_24 * 4) =
                 *(uint *)(local_40[1] + (long)local_24 * 4) | 2;
          }
        }
        local_38 = local_68;
        free(local_70);
      }
      free(local_58);
    }
    *(undefined4 *)(in_RDX + 3) = 1;
    for (local_24 = 0; local_24 < (int)uVar1; local_24 = local_24 + 1) {
      *(uint *)(local_40[1] + (long)local_24 * 4) =
           (uint)(*(int *)(local_40[1] + (long)local_24 * 4) == 3);
      if (*(int *)(local_40[1] + (long)local_24 * 4) != 0) {
        *(undefined4 *)(in_RDX + 3) = 0;
      }
    }
  }
  if (((int)in_RDX[3] == 0) && (in_RDX[4] != 0)) {
    lVar7 = 0;
    for (local_24 = 0; local_24 < (int)in_RDX[7]; local_24 = local_24 + 1) {
      if (**(long **)(in_RDX[6] + (long)local_24 * 8) == in_RDX[4]) {
        lVar7 = *(long *)(in_RDX[6] + (long)local_24 * 8);
        break;
      }
    }
    if (lVar7 == 0) {
      in_RDX[5] = *(long *)**(undefined8 **)(in_RDX[4] + 0x50);
    }
    else {
      for (local_24 = 0; local_24 < *(int *)(in_RDX[4] + 0x58); local_24 = local_24 + 1) {
        if (*(int *)(*(long *)(lVar7 + 8) + (long)local_24 * 4) != 0) {
          in_RDX[5] = **(long **)(*(long *)(in_RDX[4] + 0x50) + (long)local_24 * 8);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void prepvarinfo (struct rnndb *db, char *what, struct rnnvarinfo *vi, struct rnnvarinfo *parent) {
	if (parent)
		vi->prefenum = parent->prefenum;
	if (vi->prefixstr) {
		if (!strcmp(vi->prefixstr, "none"))
			vi->prefenum = 0;
		else
			vi->prefenum = rnn_findenum(db, vi->prefixstr); // XXX
	}
	int i;
	if (parent)
		for (i = 0; i < parent->varsetsnum; i++)
			ADDARRAY(vi->varsets, copyvarset(parent->varsets[i]));
	struct rnnenum *varset = vi->prefenum;
	if (!varset && !vi->varsetstr && parent)
		vi->varsetstr = parent->varsetstr;
	if (vi->varsetstr)
		varset = rnn_findenum(db, vi->varsetstr);
	if (vi->variantsstr) {
		char *vars = vi->variantsstr;
		if (!varset) {
			fprintf (stderr, "%s: tried to use variants without active varset!\n", what);
			db->estatus = 1;
			return;
		}
		struct rnnvarset *vs = 0;
		int nvars = varset->valsnum;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == varset) {
				vs = vi->varsets[i];
				break;
			}
		if (!vs) {
			vs = calloc (sizeof *vs, 1);
			vs->venum = varset;
			vs->variants = calloc(sizeof *vs->variants, nvars);
			for (i = 0; i < nvars; i++)
				vs->variants[i] = 1;
			ADDARRAY(vi->varsets, vs);
		}
		while (1) {
			while (*vars == ' ') vars++;
			if (*vars == 0)
				break;
			char *split = vars;
			while (*split != ':' && *split != '-' && *split != ' '  && *split != 0)
				split++;
			char *first = 0;
			if (split != vars)
				first = strndup(vars, split-vars);
			if (*split == ' ' || *split == 0) {
				int idx = findvidx(db, varset, first);
				if (idx != -1)
					vs->variants[idx] |= 2;
				vars = split;
			} else {
				char *end = split+1;
				while (*end != ' '  && *end != 0)
					end++;
				char *second = 0;
				if (end != split+1)
					second = strndup(split+1, end-split-1);
				int idx1 = 0;
				if (first)
					idx1 = findvidx(db, varset, first);
				int idx2 = nvars;
				if (second) {
					idx2 = findvidx(db, varset, second);
					if (*split == '-')
						idx2++;
				}
				if (idx1 != -1 && idx2 != -1)
					for (i = idx1; i < idx2; i++)
						vs->variants[i] |= 2;
				vars = end;
				free(second);
			}
			free(first);
		}
		vi->dead = 1;
		for (i = 0; i < nvars; i++) {
			vs->variants[i] = (vs->variants[i] == 3);
			if (vs->variants[i])
				vi->dead = 0;
		}
	}
	if (vi->dead)
		return;
	if (vi->prefenum) {
		struct rnnvarset *vs = 0;
		for (i = 0; i < vi->varsetsnum; i++)
			if (vi->varsets[i]->venum == vi->prefenum) {
				vs = vi->varsets[i];
				break;
			}
		if (vs) {
			for (i = 0; i < vi->prefenum->valsnum; i++)
				if (vs->variants[i]) {
					vi->prefix = vi->prefenum->vals[i]->name;
					return;
				}
		} else {
			vi->prefix = vi->prefenum->vals[0]->name;
		}
	}
}